

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O3

void __thiscall CPlayer::UpdateDeadSpecMode(CPlayer *this)

{
  CPlayer *pCVar1;
  long lVar2;
  
  if (((((long)this->m_SpectatorID == -1) ||
       (pCVar1 = this->m_pGameServer->m_apPlayers[this->m_SpectatorID], pCVar1 == (CPlayer *)0x0))
      || ((pCVar1->m_RespawnDisabled == true &&
          ((pCVar1->m_pCharacter == (CCharacter *)0x0 || (pCVar1->m_pCharacter->m_Alive != true)))))
      ) || (pCVar1->m_Team != this->m_Team)) {
    lVar2 = 0;
    do {
      pCVar1 = this->m_pGameServer->m_apPlayers[lVar2];
      if (((pCVar1 != (CPlayer *)0x0) &&
          ((pCVar1->m_RespawnDisabled != true ||
           ((pCVar1->m_pCharacter != (CCharacter *)0x0 && (pCVar1->m_pCharacter->m_Alive == true))))
          )) && (pCVar1->m_Team == this->m_Team)) {
        this->m_SpectatorID = (int)lVar2;
        return;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    this->m_DeadSpecMode = false;
  }
  return;
}

Assistant:

void CPlayer::UpdateDeadSpecMode()
{
	// check if actual spectator id is valid
	if(m_SpectatorID != -1 && GameServer()->m_apPlayers[m_SpectatorID] && DeadCanFollow(GameServer()->m_apPlayers[m_SpectatorID]))
		return;

	// find player to follow
	for(int i = 0; i < MAX_CLIENTS; ++i)
	{
		if(GameServer()->m_apPlayers[i] && DeadCanFollow(GameServer()->m_apPlayers[i]))
		{
			m_SpectatorID = i;
			return;
		}
	}

	// no one available to follow -> turn spectator mode off
	m_DeadSpecMode = false;
}